

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlClosure.h
# Opt level: O0

void __thiscall
dg::llvmdg::StrongControlClosure::StrongControlClosure
          (StrongControlClosure *this,Module *module,LLVMControlDependenceAnalysisOptions *opts)

{
  LLVMControlDependenceAnalysisOptions *in_RSI;
  Module *in_RDI;
  CDGraphBuilder *this_00;
  LLVMControlDependenceAnalysisOptions *in_stack_ffffffffffffff70;
  LLVMControlDependenceAnalysisImpl *in_stack_ffffffffffffff80;
  
  LLVMControlDependenceAnalysisOptions::LLVMControlDependenceAnalysisOptions
            (in_stack_ffffffffffffff70,in_RSI);
  LLVMControlDependenceAnalysisImpl::LLVMControlDependenceAnalysisImpl
            (in_stack_ffffffffffffff80,in_RDI,in_stack_ffffffffffffff70);
  LLVMControlDependenceAnalysisOptions::~LLVMControlDependenceAnalysisOptions
            (in_stack_ffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__StrongControlClosure_0029eb50;
  this_00 = (CDGraphBuilder *)(in_RDI + 0x70);
  memset(this_00,0,0x70);
  CDGraphBuilder::CDGraphBuilder(this_00);
  std::
  unordered_map<const_llvm::Function_*,_dg::llvmdg::StrongControlClosure::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::StrongControlClosure::Info>_>_>
  ::unordered_map((unordered_map<const_llvm::Function_*,_dg::llvmdg::StrongControlClosure::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::StrongControlClosure::Info>_>_>
                   *)0x231cea);
  llvm::Module::size((Module *)0x231d07);
  std::
  unordered_map<const_llvm::Function_*,_dg::llvmdg::StrongControlClosure::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::StrongControlClosure::Info>_>_>
  ::reserve((unordered_map<const_llvm::Function_*,_dg::llvmdg::StrongControlClosure::Info,_std::hash<const_llvm::Function_*>,_std::equal_to<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::llvmdg::StrongControlClosure::Info>_>_>
             *)this_00,(size_type)in_RSI);
  return;
}

Assistant:

StrongControlClosure(const llvm::Module *module,
                         const LLVMControlDependenceAnalysisOptions &opts = {})
            : LLVMControlDependenceAnalysisImpl(module, opts) {
        _graphs.reserve(module->size());
    }